

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  bool bVar1;
  bool local_89;
  uchar local_88 [8];
  uchar buf [64];
  mbedtls_entropy_context *ctx;
  size_t strong_size;
  int thresholds_reached;
  int i;
  int count;
  int ret;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  thresholds_reached = 0;
  buf._56_8_ = data;
  if (len < 0x41) {
    do {
      if (0x100 < thresholds_reached) {
        i = -0x3c;
        goto LAB_0010e094;
      }
      i = entropy_gather_internal((mbedtls_entropy_context *)buf._56_8_);
      if (i != 0) goto LAB_0010e094;
      bVar1 = true;
      ctx = (mbedtls_entropy_context *)0x0;
      for (strong_size._4_4_ = 0; strong_size._4_4_ < *(int *)(buf._56_8_ + 0xe0);
          strong_size._4_4_ = strong_size._4_4_ + 1) {
        if (*(ulong *)(buf._56_8_ + (long)strong_size._4_4_ * 0x28 + 0xf8) <
            *(ulong *)(buf._56_8_ + (long)strong_size._4_4_ * 0x28 + 0x100)) {
          bVar1 = false;
        }
        if (*(int *)(buf._56_8_ + (long)strong_size._4_4_ * 0x28 + 0x108) == 1) {
          ctx = (mbedtls_entropy_context *)
                ((long)(ctx->accumulator).total +
                *(long *)(buf._56_8_ + (long)strong_size._4_4_ * 0x28 + 0xf8) + -8);
        }
      }
      local_89 = !bVar1 || ctx < (mbedtls_entropy_context *)0x40;
      thresholds_reached = thresholds_reached + 1;
    } while (local_89);
    memset(local_88,0,0x40);
    i = mbedtls_sha512_finish_ret((mbedtls_sha512_context *)(buf._56_8_ + 8),local_88);
    if (i == 0) {
      mbedtls_sha512_free((mbedtls_sha512_context *)(buf._56_8_ + 8));
      mbedtls_sha512_init((mbedtls_sha512_context *)(buf._56_8_ + 8));
      i = mbedtls_sha512_starts_ret((mbedtls_sha512_context *)(buf._56_8_ + 8),0);
      if (((i == 0) &&
          (i = mbedtls_sha512_update_ret((mbedtls_sha512_context *)(buf._56_8_ + 8),local_88,0x40),
          i == 0)) && (i = mbedtls_sha512_ret(local_88,0x40,local_88,0), i == 0)) {
        for (strong_size._4_4_ = 0; strong_size._4_4_ < *(int *)(buf._56_8_ + 0xe0);
            strong_size._4_4_ = strong_size._4_4_ + 1) {
          *(undefined8 *)(buf._56_8_ + (long)strong_size._4_4_ * 0x28 + 0xf8) = 0;
        }
        memcpy(output,local_88,len);
        i = 0;
      }
    }
LAB_0010e094:
    mbedtls_platform_zeroize(local_88,0x40);
    data_local._4_4_ = i;
  }
  else {
    data_local._4_4_ = -0x3c;
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, thresholds_reached;
    size_t strong_size;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if( ctx->initial_entropy_run == 0 )
    {
        ctx->initial_entropy_run = 1;
        if( ( ret = mbedtls_entropy_update_nv_seed( ctx ) ) != 0 )
            return( ret );
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        thresholds_reached = 1;
        strong_size = 0;
        for( i = 0; i < ctx->source_count; i++ )
        {
            if( ctx->source[i].size < ctx->source[i].threshold )
                thresholds_reached = 0;
            if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
                strong_size += ctx->source[i].size;
        }
    }
    while( ! thresholds_reached || strong_size < MBEDTLS_ENTROPY_BLOCK_SIZE );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if( ( ret = mbedtls_sha512_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha512_free( &ctx->accumulator );
    mbedtls_sha512_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha512_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha512_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-512 on entropy
     */
    if( ( ret = mbedtls_sha512_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    if( ( ret = mbedtls_sha256_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha256_free( &ctx->accumulator );
    mbedtls_sha256_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha256_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha256_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-256 on entropy
     */
    if( ( ret = mbedtls_sha256_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}